

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int match_digits(int *acc,char **str,size_t *len,char *tpl,date_parse_string *capture)

{
  int iVar1;
  char *in_RCX;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  long *in_R8;
  size_t rem;
  char *p;
  long local_40;
  char *local_38;
  char *local_28;
  
  local_38 = (char *)*in_RSI;
  local_40 = *in_RDX;
  *in_RDI = 0;
  local_28 = in_RCX;
  do {
    if (*local_28 == '\0') {
      *in_R8 = *in_RSI;
      in_R8[1] = (long)local_38 - *in_RSI;
      *in_RSI = (long)local_38;
      *in_RDX = local_40;
      return 1;
    }
    if (*local_28 == ',') {
      local_28 = local_28 + -1;
      if ((local_40 == 0) || ((*local_38 != ',' && (*local_38 != '.')))) {
        local_38 = local_38 + -1;
        local_40 = local_40 + 1;
      }
    }
    else {
      if ((local_40 == 0) || (iVar1 = is_digit(L'\0'), iVar1 == 0)) {
        return 0;
      }
      if ((*local_38 < *local_28) || (local_28[1] < *local_38)) {
        return 0;
      }
      *in_RDI = *in_RDI * 10;
      iVar1 = value_of_digit((int)*local_38);
      *in_RDI = iVar1 + *in_RDI;
    }
    local_28 = local_28 + 2;
    local_38 = local_38 + 1;
    local_40 = local_40 + -1;
  } while( true );
}

Assistant:

static int match_digits(int &acc, const char *&str, size_t &len,
                        const char *tpl, date_parse_string &capture)
{
    /* set up a private pointer to the string */
    const char *p = str;
    size_t rem = len;

    /* match each template pair */
    acc = 0;
    for ( ; *tpl != '\0' ; tpl += 2, ++p, --rem)
    {
        /* check for the special match to a period or comma */
        if (*tpl == ',')
        {
            /* back up to make up for the normal double increment */
            --tpl;
            
            /* allow it to match, but don't require it */
            if (rem != 0 && (*p == ',' || *p == '.'))
                continue;

            /* it doesn't match; simply say on the same input character */
            --p, ++rem;
            continue;
        }
        
        /* if this input char isn't a digit, we don't have a match */
        if (rem == 0 || !is_digit(*p))
            return FALSE;

        /* if this digit is out of range, it's not a match */
        if (*p < tpl[0] || *p > tpl[1])
            return FALSE;

        /* matched this digit - add it to the accumulator */
        acc *= 10;
        acc += value_of_digit(*p);
    }

    /* set the capture data */
    capture.p = str;
    capture.len = p - str;

    /* advance the caller's string pointers past the match */
    str = p;
    len = rem;

    /* return success */
    return TRUE;
}